

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::crc_internal::CRC32::UnextendByZeroes(CRC32 *this,uint32_t *crc,size_t length)

{
  uint uVar1;
  
  uVar1 = *crc;
  uVar1 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = (uVar1 & 0xf0f0f0f) << 4 | uVar1 >> 4 & 0xf0f0f0f;
  uVar1 = (uVar1 >> 2 & 0x33333333) + (uVar1 & 0x33333333) * 4;
  *crc = (uVar1 >> 1 & 0x55555555) + (uVar1 & 0x55555555) * 2;
  ExtendByZeroesImpl(crc,length,this->reverse_zeroes_,this->reverse_table0_);
  uVar1 = *crc;
  uVar1 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = (uVar1 & 0xf0f0f0f) << 4 | uVar1 >> 4 & 0xf0f0f0f;
  uVar1 = (uVar1 >> 2 & 0x33333333) + (uVar1 & 0x33333333) * 4;
  *crc = (uVar1 >> 1 & 0x55555555) + (uVar1 & 0x55555555) * 2;
  return;
}

Assistant:

void CRC32::UnextendByZeroes(uint32_t* crc, size_t length) const {
  // See the comment in CRC32::InitTables() for an explanation of the algorithm
  // below.
  *crc = ReverseBits(*crc);
  ExtendByZeroesImpl(crc, length, reverse_zeroes_, reverse_table0_);
  *crc = ReverseBits(*crc);
}